

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::filterContents(QPDFPageObjectHelper *this,TokenFilter *filter,Pipeline *next)

{
  bool bVar1;
  BaseHandle *pBVar2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  pBVar2 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::filterAsContents((QPDFObjectHandle *)&_Stack_38,filter,next);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::filterPageContents((QPDFObjectHandle *)&_Stack_38,filter,next);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::filterContents(QPDFObjectHandle::TokenFilter* filter, Pipeline* next)
{
    if (oh().isFormXObject()) {
        oh().filterAsContents(filter, next);
    } else {
        oh().filterPageContents(filter, next);
    }
}